

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O2

idx_t duckdb::FindStrInStr(uchar *haystack,idx_t haystack_size,uchar *needle,idx_t needle_size)

{
  short sVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uchar *haystack_00;
  short *psVar5;
  uint *puVar6;
  long *plVar7;
  size_t sVar8;
  long lVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iStack_40;
  
  haystack_00 = (uchar *)memchr(haystack,(uint)*needle,haystack_size);
  if (haystack_00 == (uchar *)0x0) {
    return 0xffffffffffffffff;
  }
  iVar10 = (long)haystack_00 - (long)haystack;
  uVar11 = haystack_size - iVar10;
  switch(needle_size) {
  case 1:
    return iVar10;
  case 2:
    if (uVar11 < 2) {
      return 0xffffffffffffffff;
    }
    sVar1 = *(short *)needle;
    uVar12 = 0;
    while ((sVar8 = (uVar11 - 1) - uVar12, uVar12 <= uVar11 - 1 && sVar8 != 0 &&
           (psVar5 = (short *)memchr(haystack_00 + uVar12,(uint)(byte)sVar1,sVar8),
           psVar5 != (short *)0x0))) {
      lVar9 = (long)psVar5 - (long)haystack_00;
      if (sVar1 == *psVar5) goto LAB_0082e35a;
      uVar12 = lVar9 + 1;
    }
    break;
  case 3:
    if (uVar11 < 3) {
      return 0xffffffffffffffff;
    }
    sVar1 = *(short *)needle;
    uVar12 = 0;
    while ((sVar8 = (uVar11 - 2) - uVar12, uVar12 <= uVar11 - 2 && sVar8 != 0 &&
           (psVar5 = (short *)memchr(haystack_00 + uVar12,(uint)*needle,sVar8),
           psVar5 != (short *)0x0))) {
      lVar9 = (long)psVar5 - (long)haystack_00;
      if ((sVar1 == *psVar5) &&
         (bVar4 = ContainsUnaligned::MatchRemainder<unsigned_short>((uchar *)psVar5,needle,3), bVar4
         )) {
LAB_0082e364:
        return lVar9 + iVar10;
      }
      uVar12 = lVar9 + 1;
    }
    break;
  case 4:
    if (uVar11 < 4) {
      return 0xffffffffffffffff;
    }
    uVar2 = *(uint *)needle;
    uVar12 = 0;
    while ((sVar8 = (uVar11 - 3) - uVar12, uVar12 <= uVar11 - 3 && sVar8 != 0 &&
           (puVar6 = (uint *)memchr(haystack_00 + uVar12,uVar2 & 0xff,sVar8), puVar6 != (uint *)0x0)
           )) {
      lVar9 = (long)puVar6 - (long)haystack_00;
      if (uVar2 == *puVar6) goto LAB_0082e35a;
      uVar12 = lVar9 + 1;
    }
    break;
  case 5:
    iStack_40 = 5;
    goto LAB_0082e2e3;
  case 6:
    iStack_40 = 6;
    goto LAB_0082e2e3;
  case 7:
    iStack_40 = 7;
LAB_0082e2e3:
    iVar10 = Contains<unsigned_int,duckdb::ContainsUnaligned>
                       (haystack_00,uVar11,needle,iStack_40,iVar10);
    return iVar10;
  case 8:
    if (uVar11 < 8) {
      return 0xffffffffffffffff;
    }
    lVar3 = *(long *)needle;
    uVar12 = 0;
    while( true ) {
      sVar8 = (uVar11 - 7) - uVar12;
      if (uVar11 - 7 < uVar12 || sVar8 == 0) {
        return 0xffffffffffffffff;
      }
      plVar7 = (long *)memchr(haystack_00 + uVar12,(uint)lVar3 & 0xff,sVar8);
      if (plVar7 == (long *)0x0) {
        return 0xffffffffffffffff;
      }
      lVar9 = (long)plVar7 - (long)haystack_00;
      if (lVar3 == *plVar7) break;
      uVar12 = lVar9 + 1;
    }
LAB_0082e35a:
    return lVar9 + iVar10;
  default:
    if (uVar11 < needle_size) {
      return 0xffffffffffffffff;
    }
    uVar12 = (uVar11 - needle_size) + 1;
    lVar3 = *(long *)needle;
    uVar11 = 0;
    while ((sVar8 = uVar12 - uVar11, uVar11 <= uVar12 && sVar8 != 0 &&
           (plVar7 = (long *)memchr(haystack_00 + uVar11,(uint)*needle,sVar8), plVar7 != (long *)0x0
           ))) {
      lVar9 = (long)plVar7 - (long)haystack_00;
      if ((lVar3 == *plVar7) &&
         (bVar4 = ContainsGeneric::MatchRemainder<unsigned_long>((uchar *)plVar7,needle,needle_size)
         , bVar4)) goto LAB_0082e364;
      uVar11 = lVar9 + 1;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t FindStrInStr(const unsigned char *haystack, idx_t haystack_size, const unsigned char *needle, idx_t needle_size) {
	D_ASSERT(needle_size > 0);
	// start off by performing a memchr to find the first character of the
	auto location = memchr(haystack, needle[0], haystack_size);
	if (location == nullptr) {
		return DConstants::INVALID_INDEX;
	}
	idx_t base_offset = UnsafeNumericCast<idx_t>(const_uchar_ptr_cast(location) - haystack);
	haystack_size -= base_offset;
	haystack = const_uchar_ptr_cast(location);
	// switch algorithm depending on needle size
	switch (needle_size) {
	case 1:
		return base_offset;
	case 2:
		return Contains<uint16_t, ContainsAligned>(haystack, haystack_size, needle, 2, base_offset);
	case 3:
		return Contains<uint16_t, ContainsUnaligned>(haystack, haystack_size, needle, 3, base_offset);
	case 4:
		return Contains<uint32_t, ContainsAligned>(haystack, haystack_size, needle, 4, base_offset);
	case 5:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 5, base_offset);
	case 6:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 6, base_offset);
	case 7:
		return Contains<uint32_t, ContainsUnaligned>(haystack, haystack_size, needle, 7, base_offset);
	case 8:
		return Contains<uint64_t, ContainsAligned>(haystack, haystack_size, needle, 8, base_offset);
	default:
		return Contains<uint64_t, ContainsGeneric>(haystack, haystack_size, needle, needle_size, base_offset);
	}
}